

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLoadZeroExpr
          (BinaryReaderInterp *this,Opcode opcode,Index memidx,Address align_log2,Address offset)

{
  Result RVar1;
  Address alignment;
  Location loc_1;
  Location loc;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,memidx,&loc_1);
  alignment = 0xffffffff;
  if (align_log2 < 0x20) {
    alignment = (ulong)(uint)(1 << ((byte)align_log2 & 0x1f));
  }
  RVar1 = SharedValidator::OnLoadZero(&this->validator_,&loc,opcode,&local_78,alignment,offset);
  Var::~Var(&local_78);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,opcode.enum_,memidx,(u32)offset);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnLoadZeroExpr(Opcode opcode,
                                          Index memidx,
                                          Address align_log2,
                                          Address offset) {
  CHECK_RESULT(validator_.OnLoadZero(GetLocation(), opcode,
                                     Var(memidx, GetLocation()),
                                     GetAlignment(align_log2), offset));
  istream_.Emit(opcode, memidx, offset);
  return Result::Ok;
}